

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimePerformInt
               (SC_Lib *pLib,Abc_Ntk_t *pNtk,int nTreeCRatio,int fUseWireLoads,int fShowAll,
               int fPrintPath,int fDumpStats)

{
  int iVar1;
  SC_Man *p;
  FILE *__stream;
  char *pcVar2;
  abctime aVar3;
  
  p = Abc_SclManStart(pLib,pNtk,fUseWireLoads,1,0.0,nTreeCRatio);
  Abc_SclTimeNtkPrint(p,fShowAll,fPrintPath);
  if (fDumpStats != 0) {
    __stream = fopen("stats.txt","a+");
    pcVar2 = p->pNtk->pName;
    iVar1 = strcmp(Abc_SclDumpStats_FileNameOld,pcVar2);
    if (iVar1 == 0) {
      fputc(0x20,__stream);
      fprintf(__stream,"%.1f ",
              ((double)p->pNtk->nObjCounts[7] * 100.0) / (double)Abc_SclDumpStats_nNodesOld);
      fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats_nAreaOld
             );
      fprintf(__stream,"%.1f ",
              ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats_nDelayOld);
      aVar3 = Abc_Clock();
      fprintf(__stream,"%.2f",(double)(aVar3 - Abc_SclDumpStats_clk) / 1000000.0);
    }
    else {
      strcpy(Abc_SclDumpStats_FileNameOld,pcVar2);
      fputc(10,__stream);
      pcVar2 = Extra_FileNameWithoutPath(p->pNtk->pName);
      fprintf(__stream,"%s ",pcVar2);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPis->nSize);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPos->nSize);
      Abc_SclDumpStats_nNodesOld = p->pNtk->nObjCounts[7];
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nAreaOld = (int)p->SumArea;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nDelayOld = (int)p->ReportDelay;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_clk = Abc_Clock();
    }
    fclose(__stream);
  }
  Abc_SclManFree(p);
  return;
}

Assistant:

void Abc_SclTimePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, int nTreeCRatio, int fUseWireLoads, int fShowAll, int fPrintPath, int fDumpStats )
{
    SC_Man * p;
    p = Abc_SclManStart( pLib, pNtk, fUseWireLoads, 1, 0, nTreeCRatio );
    Abc_SclTimeNtkPrint( p, fShowAll, fPrintPath );
    if ( fDumpStats )
        Abc_SclDumpStats( p, "stats.txt", 0 );
    Abc_SclManFree( p );
}